

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psa_crypto.c
# Opt level: O2

psa_status_t psa_mac_finish_internal(psa_mac_operation_t *operation,uint8_t *mac,size_t mac_size)

{
  int ret;
  psa_status_t pVar1;
  uint8_t tmp [16];
  
  pVar1 = -0x89;
  if ((operation->field_0x4 & 6) != 2 && (operation->field_0x4 & 1) != 0) {
    pVar1 = -0x8a;
    if (operation->mac_size <= mac_size) {
      if (operation->alg == 0x2c00002) {
        ret = mbedtls_cipher_cmac_finish(&(operation->ctx).cmac,tmp);
        if (ret == 0) {
          memcpy(mac,tmp,(ulong)operation->mac_size);
        }
        mbedtls_platform_zeroize(tmp,0x10);
        pVar1 = mbedtls_to_psa_error(ret);
      }
      else {
        pVar1 = -0x89;
        if ((operation->alg & 0x7fc00000) == 0x2800000) {
          pVar1 = psa_hmac_finish_internal(&(operation->ctx).hmac,mac,(ulong)operation->mac_size);
          return pVar1;
        }
      }
    }
  }
  return pVar1;
}

Assistant:

static psa_status_t psa_mac_finish_internal( psa_mac_operation_t *operation,
                                             uint8_t *mac,
                                             size_t mac_size )
{
    if( ! operation->key_set )
        return( PSA_ERROR_BAD_STATE );
    if( operation->iv_required && ! operation->iv_set )
        return( PSA_ERROR_BAD_STATE );

    if( mac_size < operation->mac_size )
        return( PSA_ERROR_BUFFER_TOO_SMALL );

#if defined(MBEDTLS_CMAC_C)
    if( operation->alg == PSA_ALG_CMAC )
    {
        uint8_t tmp[PSA_MAX_BLOCK_CIPHER_BLOCK_SIZE];
        int ret = mbedtls_cipher_cmac_finish( &operation->ctx.cmac, tmp );
        if( ret == 0 )
            memcpy( mac, tmp, operation->mac_size );
        mbedtls_platform_zeroize( tmp, sizeof( tmp ) );
        return( mbedtls_to_psa_error( ret ) );
    }
    else
#endif /* MBEDTLS_CMAC_C */
#if defined(MBEDTLS_MD_C)
    if( PSA_ALG_IS_HMAC( operation->alg ) )
    {
        return( psa_hmac_finish_internal( &operation->ctx.hmac,
                                          mac, operation->mac_size ) );
    }
    else
#endif /* MBEDTLS_MD_C */
    {
        /* This shouldn't happen if `operation` was initialized by
         * a setup function. */
        return( PSA_ERROR_BAD_STATE );
    }
}